

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

Decorator * ftxui::operator|(Decorator *__return_storage_ptr__,Decorator *a,Decorator *b)

{
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> local_60;
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> local_40;
  Decorator *local_20;
  Decorator *b_local;
  Decorator *a_local;
  
  local_20 = b;
  b_local = a;
  a_local = __return_storage_ptr__;
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function(&local_40,a);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function(&local_60,b);
  anon_unknown_2::compose(__return_storage_ptr__,&local_40,&local_60);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_60);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Decorator operator|(Decorator a, Decorator b) {
  return compose(std::move(a),  //
                 std::move(b));
}